

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase71::run(TestCase71 *this)

{
  undefined8 uVar1;
  bool bVar2;
  StringPtr *pSVar3;
  StringPtr **ppSVar4;
  NullableValue<kj::Exception> *other;
  Exception *pEVar5;
  char (*params) [4];
  anon_class_8_1_a8aa2aee *extraout_RDX;
  anon_class_8_1_a8aa2aee *extraout_RDX_00;
  anon_class_8_1_a8aa2aee *func;
  anon_class_8_1_a8aa2aee *extraout_RDX_01;
  char (*extraout_RDX_02) [6];
  char (*extraout_RDX_03) [6];
  char (*params_00) [6];
  char (*extraout_RDX_04) [6];
  char (*params_01) [6];
  bool local_1361;
  StringPtr *pSStack_1360;
  bool _kj_shouldLog_56;
  StringPtr **local_1358;
  undefined1 local_1350 [8];
  DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> _kjCondition_55;
  DebugExpression<kj::StringPtr_&> DStack_1320;
  bool _kj_shouldLog_55;
  undefined1 local_1318 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> _kjCondition_54;
  DebugExpression<kj::StringPtr_&> DStack_12e8;
  bool _kj_shouldLog_54;
  undefined1 local_12e0 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> _kjCondition_53;
  DebugExpression<kj::StringPtr_&> DStack_12b0;
  bool _kj_shouldLog_53;
  undefined1 local_12a8 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_52;
  DebugExpression<kj::StringPtr_&> DStack_1278;
  bool _kj_shouldLog_52;
  undefined1 local_1270 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> _kjCondition_51;
  DebugExpression<kj::StringPtr_&> DStack_1240;
  bool _kj_shouldLog_51;
  undefined1 local_1238 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> _kjCondition_50;
  StringPtr *iter_3;
  bool _kj_shouldLog_50;
  size_t sStack_1200;
  DebugExpression<unsigned_long> local_11f8;
  undefined1 local_11f0 [8];
  DebugComparison<unsigned_long,_int>_conflict _kjCondition_49;
  StringPtr *pSStack_11c0;
  bool _kj_shouldLog_49;
  StringPtr *local_11b8;
  Fault local_11b0;
  Maybe<kj::StringPtr_&> local_11a8;
  StringPtr *local_11a0;
  StringPtr *_kj_result_8;
  StringPtr *local_1190;
  undefined1 local_1188 [8];
  DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> _kjCondition_48;
  bool _kj_shouldLog_48;
  Fault local_1150;
  Maybe<kj::StringPtr_&> local_1148;
  StringPtr *local_1140;
  StringPtr *_kj_result_7;
  undefined1 local_1130 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> _kjCondition_47;
  char *pcStack_1100;
  bool _kj_shouldLog_47;
  char *local_10f8;
  char *local_10f0;
  undefined1 local_10e8 [8];
  DebugComparison<const_char_*,_char_*> _kjCondition_46;
  DebugExpression<kj::StringPtr_&> DStack_10b8;
  bool _kj_shouldLog_46;
  undefined1 local_10b0 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> _kjCondition_45;
  StringPtr *waldo;
  char insertWaldo [7];
  undefined1 local_1060 [8];
  char searchWaldo [7];
  bool local_1045;
  int local_1044;
  bool _kj_shouldLog_45;
  size_t sStack_1040;
  DebugExpression<unsigned_long> local_1038;
  undefined1 local_1030 [8];
  DebugComparison<unsigned_long,_int>_conflict _kjCondition_44;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> local_1000 [7];
  bool _kj_shouldLog_44;
  DebugExpressionStart local_ff8 [8];
  undefined1 local_ff0 [8];
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition_43;
  StringPtr *pSStack_fc0;
  bool _kj_shouldLog_43;
  StringPtr *local_fb8;
  Fault local_fb0;
  Maybe<kj::StringPtr_&> local_fa8;
  StringPtr *local_fa0;
  StringPtr *_kj_result_6;
  StringPtr *local_f90;
  undefined1 local_f88 [8];
  DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> _kjCondition_42;
  char *pcStack_f58;
  bool _kj_shouldLog_42;
  char *local_f50;
  char *local_f48;
  undefined1 local_f40 [8];
  DebugComparison<const_char_*,_const_char_*> _kjCondition_41;
  StringPtr *pSStack_f10;
  bool _kj_shouldLog_41;
  Type local_f01;
  StringPtr *local_f00;
  StringPtr *local_ef8;
  undefined1 local_ef0 [8];
  DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> _kjCondition_40;
  StringPtr origGrault;
  StringPtr *graultRow;
  StringPtr *pSStack_ea8;
  bool _kj_shouldLog_40;
  StringPtr **local_ea0;
  undefined1 local_e98 [8];
  DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> _kjCondition_39;
  DebugExpression<kj::StringPtr_&> DStack_e68;
  bool _kj_shouldLog_39;
  undefined1 local_e60 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> _kjCondition_38;
  DebugExpression<kj::StringPtr_&> DStack_e30;
  bool _kj_shouldLog_38;
  undefined1 local_e28 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_37;
  DebugExpression<kj::StringPtr_&> DStack_df8;
  bool _kj_shouldLog_37;
  undefined1 local_df0 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> _kjCondition_36;
  DebugExpression<kj::StringPtr_&> DStack_dc0;
  bool _kj_shouldLog_36;
  undefined1 local_db8 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> _kjCondition_35;
  StringPtr *iter_2;
  bool _kj_shouldLog_35;
  size_t sStack_d80;
  DebugExpression<unsigned_long> local_d78;
  undefined1 local_d70 [8];
  DebugComparison<unsigned_long,_int>_conflict _kjCondition_34;
  int local_d40;
  bool _kj_shouldLog_34;
  size_t local_d38;
  DebugExpression<unsigned_long> local_d30;
  undefined1 local_d28 [8];
  DebugComparison<unsigned_long,_int>_conflict _kjCondition_33;
  undefined1 local_cf8 [7];
  bool _kj_shouldLog_33;
  StringPtr *local_ce8;
  undefined1 local_ce0 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_32;
  bool _kj_shouldLog_32;
  size_t sStack_cb0;
  DebugExpression<unsigned_long> local_ca8;
  undefined1 local_ca0 [8];
  DebugComparison<unsigned_long,_int>_conflict _kjCondition_31;
  undefined1 local_c70 [6];
  bool _kj_shouldLog_31;
  bool _kj_shouldLog_30;
  ArrayPtr<const_char> local_c60;
  bool local_c4a;
  DebugExpression<bool> local_c49;
  Exception *pEStack_c48;
  DebugExpression<bool> _kjCondition_30;
  Exception_conflict *e;
  Maybe<kj::Exception> local_c38;
  undefined1 local_aa0 [8];
  NullableValue<kj::Exception> _e139;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> local_900 [7];
  bool _kj_shouldLog_29;
  DebugExpressionStart local_8f8 [8];
  undefined1 local_8f0 [8];
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition_29;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> local_8c0 [7];
  bool _kj_shouldLog_28;
  DebugExpressionStart local_8b8 [8];
  undefined1 local_8b0 [8];
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition_28;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> local_880 [7];
  bool _kj_shouldLog_27;
  DebugExpressionStart local_878 [8];
  undefined1 local_870 [8];
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition_27;
  bool _kj_shouldLog_26;
  size_t sStack_840;
  DebugExpression<unsigned_long> local_838;
  undefined1 local_830 [8];
  DebugComparison<unsigned_long,_int>_conflict _kjCondition_26;
  undefined1 auStack_7f8 [8];
  StringPtr STRS [3];
  bool local_7b9;
  StringPtr *pSStack_7b8;
  bool _kj_shouldLog_25;
  StringPtr *local_7b0;
  StringPtr *local_7a8;
  undefined1 local_7a0 [8];
  DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> _kjCondition_25;
  Fault local_770;
  Maybe<kj::StringPtr_&> local_768;
  StringPtr *local_760;
  StringPtr *_kj_result_5;
  StringPtr *found;
  StringPtr *local_748;
  StringPtr local_740;
  undefined1 local_730 [8];
  char copy [7];
  anon_class_1_0_00000001 local_711;
  StringPtr local_710;
  StringPtr *local_700;
  StringPtr *row;
  StringPtr *pSStack_6f0;
  bool _kj_shouldLog_24;
  StringPtr **local_6e8;
  undefined1 local_6e0 [8];
  DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> _kjCondition_24;
  DebugExpression<kj::StringPtr_&> DStack_6b0;
  bool _kj_shouldLog_23;
  undefined1 local_6a8 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_23;
  DebugExpression<kj::StringPtr_&> DStack_678;
  bool _kj_shouldLog_22;
  undefined1 local_670 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_22;
  StringPtr *iter_1;
  bool _kj_shouldLog_21;
  Fault local_630;
  Maybe<kj::StringPtr_&> local_628;
  StringPtr *local_620;
  StringPtr *_kj_result_4;
  undefined1 local_610 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_21;
  bool _kj_shouldLog_20;
  Fault local_5d8;
  Maybe<kj::StringPtr_&> local_5d0;
  StringPtr *local_5c8;
  StringPtr *_kj_result_3;
  undefined1 local_5b8 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_20;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> local_588 [7];
  bool _kj_shouldLog_19;
  DebugExpressionStart local_580 [8];
  undefined1 local_578 [8];
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition_19;
  bool _kj_shouldLog_18;
  size_t sStack_548;
  DebugExpression<unsigned_long> local_540;
  undefined1 local_538 [8];
  DebugComparison<unsigned_long,_int>_conflict _kjCondition_18;
  bool _kj_shouldLog_17;
  DebugExpression<bool> _kjCondition_17;
  StringPtr *pSStack_508;
  bool _kj_shouldLog_16;
  StringPtr **local_500;
  undefined1 local_4f8 [8];
  DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> _kjCondition_16;
  DebugExpression<kj::StringPtr_&> DStack_4c8;
  bool _kj_shouldLog_15;
  undefined1 local_4c0 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_15;
  DebugExpression<kj::StringPtr_&> DStack_490;
  bool _kj_shouldLog_14;
  undefined1 local_488 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_14;
  DebugExpression<kj::StringPtr_&> DStack_458;
  bool _kj_shouldLog_13;
  undefined1 local_450 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_13;
  StringPtr *iter;
  bool _kj_shouldLog_12;
  size_t sStack_418;
  DebugExpression<unsigned_long> local_410;
  undefined1 local_408 [8];
  DebugComparison<unsigned_long,_int>_conflict _kjCondition_12;
  StringPtr *pSStack_3d8;
  bool _kj_shouldLog_11;
  StringPtr *local_3d0;
  StringPtr *local_3c8;
  undefined1 local_3c0 [8];
  DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> _kjCondition_11;
  Fault local_390;
  Maybe<kj::StringPtr_&> local_388;
  StringPtr *local_380;
  StringPtr *_kj_result_2;
  StringPtr *ref2;
  DebugExpression<kj::StringPtr_&> DStack_368;
  bool _kj_shouldLog_10;
  undefined1 local_360 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_10;
  StringPtr *ref;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> local_318 [7];
  bool _kj_shouldLog_9;
  DebugExpressionStart local_310 [8];
  undefined1 local_308 [8];
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition_9;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> local_2d8 [7];
  bool _kj_shouldLog_8;
  DebugExpressionStart local_2d0 [8];
  undefined1 local_2c8 [8];
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition_8;
  bool _kj_shouldLog_7;
  Fault local_290;
  Maybe<kj::StringPtr_&> local_288;
  StringPtr *local_280;
  StringPtr *_kj_result_1;
  undefined1 local_270 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_7;
  bool _kj_shouldLog_6;
  Fault local_238;
  Maybe<kj::StringPtr_&> local_230;
  StringPtr *local_228;
  StringPtr *_kj_result;
  undefined1 local_218 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_6;
  bool _kj_shouldLog_5;
  size_t sStack_1e8;
  DebugExpression<unsigned_long> local_1e0;
  undefined1 local_1d8 [8];
  DebugComparison<unsigned_long,_int>_conflict _kjCondition_5;
  undefined1 local_1a8 [7];
  bool _kj_shouldLog_4;
  StringPtr *local_198;
  undefined1 local_190 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_4;
  bool _kj_shouldLog_3;
  size_t sStack_160;
  DebugExpression<unsigned_long> local_158;
  undefined1 local_150 [8];
  DebugComparison<unsigned_long,_int>_conflict _kjCondition_3;
  undefined1 local_120 [7];
  bool _kj_shouldLog_2;
  StringPtr *local_110;
  undefined1 local_108 [8];
  DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> _kjCondition_2;
  bool _kj_shouldLog_1;
  size_t sStack_d8;
  DebugExpression<unsigned_long> local_d0;
  undefined1 local_c8 [8];
  DebugComparison<unsigned_long,_int>_conflict _kjCondition_1;
  bool _kj_shouldLog;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> local_90 [8];
  DebugExpressionStart local_88 [8];
  undefined1 local_80 [8];
  DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> _kjCondition;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> table;
  TestCase71 *this_local;
  
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::Table
            ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
             &_kjCondition.result);
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>(local_90,(char (*) [7])&_kjCondition.result);
  DebugExpressionStart::operator<<(local_88,(Maybe<kj::StringPtr_&> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<kj::StringPtr&>>::operator==
            ((DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_80,
             (DebugExpression<kj::Maybe<kj::StringPtr&>> *)local_88,(None *)&kj::none);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_80);
  if (!bVar2) {
    _kjCondition_1._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_1._35_1_ != '\0') {
      Debug::
      log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x4a,ERROR,
                 "\"failed: expected \" \"table.find(\\\"foo\\\") == kj::none\", _kjCondition",
                 (char (*) [47])"failed: expected table.find(\"foo\") == kj::none",
                 (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_80);
      _kjCondition_1._35_1_ = 0;
    }
  }
  sStack_d8 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::size
                        ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                          *)&_kjCondition.result);
  local_d0 = DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&_::MAGIC_ASSERT,&stack0xffffffffffffff28);
  _kjCondition_2._36_4_ = 0;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_c8,&local_d0,
             (int *)&_kjCondition_2.field_0x24);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_c8);
  if (!bVar2) {
    _kjCondition_2._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_2._35_1_ != '\0') {
      Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x4c,ERROR,"\"failed: expected \" \"table.size() == 0\", _kjCondition",
                 (char (*) [35])"failed: expected table.size() == 0",
                 (DebugComparison<unsigned_long,_int>_conflict *)local_c8);
      _kjCondition_2._35_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_120,"foo");
  pSVar3 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::insert
                     ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)&_kjCondition.result,(StringPtr *)local_120);
  local_110 = (StringPtr *)
              DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,pSVar3);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_108,
             (DebugExpression<kj::StringPtr&> *)&local_110,(char (*) [7])0x31cf85);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_108);
  if (!bVar2) {
    _kjCondition_3._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_3._39_1_ != '\0') {
      Debug::log<char_const(&)[46],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x4d,ERROR,
                 "\"failed: expected \" \"table.insert(\\\"foo\\\") == \\\"foo\\\"\", _kjCondition",
                 (char (*) [46])"failed: expected table.insert(\"foo\") == \"foo\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_108);
      _kjCondition_3._39_1_ = 0;
    }
  }
  sStack_160 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
               size((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                     *)&_kjCondition.result);
  local_158 = DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,&stack0xfffffffffffffea0);
  _kjCondition_4._36_4_ = 1;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_150,&local_158,
             (int *)&_kjCondition_4.field_0x24);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_150);
  if (!bVar2) {
    _kjCondition_4._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_4._35_1_ != '\0') {
      Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x4e,ERROR,"\"failed: expected \" \"table.size() == 1\", _kjCondition",
                 (char (*) [35])"failed: expected table.size() == 1",
                 (DebugComparison<unsigned_long,_int>_conflict *)local_150);
      _kjCondition_4._35_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_1a8,"bar");
  pSVar3 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::insert
                     ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)&_kjCondition.result,(StringPtr *)local_1a8);
  local_198 = (StringPtr *)
              DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,pSVar3);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_190,
             (DebugExpression<kj::StringPtr&> *)&local_198,(char (*) [7])0x30fda1);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_190);
  if (!bVar2) {
    _kjCondition_5._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_5._39_1_ != '\0') {
      Debug::log<char_const(&)[46],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x4f,ERROR,
                 "\"failed: expected \" \"table.insert(\\\"bar\\\") == \\\"bar\\\"\", _kjCondition",
                 (char (*) [46])"failed: expected table.insert(\"bar\") == \"bar\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_190);
      _kjCondition_5._39_1_ = 0;
    }
  }
  sStack_1e8 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
               size((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                     *)&_kjCondition.result);
  local_1e0 = DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,&stack0xfffffffffffffe18);
  _kjCondition_6._36_4_ = 2;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_1d8,&local_1e0,
             (int *)&_kjCondition_6.field_0x24);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d8);
  if (!bVar2) {
    _kjCondition_6._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_6._35_1_ != '\0') {
      Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x50,ERROR,"\"failed: expected \" \"table.size() == 2\", _kjCondition",
                 (char (*) [35])"failed: expected table.size() == 2",
                 (DebugComparison<unsigned_long,_int>_conflict *)local_1d8);
      _kjCondition_6._35_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &local_230,(char (*) [7])&_kjCondition.result);
  local_228 = readMaybe<kj::StringPtr>(&local_230);
  if (local_228 == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_238,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,0x52,FAILED,"table.find(\"foo\") != nullptr","");
    Debug::Fault::fatal(&local_238);
  }
  ppSVar4 = mv<kj::StringPtr*>(&local_228);
  _kj_result = (StringPtr *)
               DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,*ppSVar4);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_218,
             (DebugExpression<kj::StringPtr&> *)&_kj_result,(char (*) [7])0x31cf85);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_218);
  if (!bVar2) {
    _kjCondition_7._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_7._39_1_ != '\0') {
      Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x52,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"foo\\\")) == \\\"foo\\\"\", _kjCondition"
                 ,(char (*) [63])
                  "failed: expected KJ_ASSERT_NONNULL(table.find(\"foo\")) == \"foo\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_218);
      _kjCondition_7._39_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &local_288,(char (*) [7])&_kjCondition.result);
  local_280 = readMaybe<kj::StringPtr>(&local_288);
  if (local_280 == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_290,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,0x53,FAILED,"table.find(\"bar\") != nullptr","");
    Debug::Fault::fatal(&local_290);
  }
  ppSVar4 = mv<kj::StringPtr*>(&local_280);
  _kj_result_1 = (StringPtr *)
                 DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,*ppSVar4)
  ;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_270,
             (DebugExpression<kj::StringPtr&> *)&_kj_result_1,(char (*) [7])0x30fda1);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_270);
  if (!bVar2) {
    _kjCondition_8._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_8._39_1_ != '\0') {
      Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x53,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"bar\\\")) == \\\"bar\\\"\", _kjCondition"
                 ,(char (*) [63])
                  "failed: expected KJ_ASSERT_NONNULL(table.find(\"bar\")) == \"bar\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_270);
      _kjCondition_8._39_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>(local_2d8,(char (*) [7])&_kjCondition.result);
  DebugExpressionStart::operator<<(local_2d0,(Maybe<kj::StringPtr_&> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<kj::StringPtr&>>::operator==
            ((DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_2c8,
             (DebugExpression<kj::Maybe<kj::StringPtr&>> *)local_2d0,(None *)&kj::none);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_2c8);
  if (!bVar2) {
    _kjCondition_9._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_9._39_1_ != '\0') {
      Debug::
      log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x54,ERROR,
                 "\"failed: expected \" \"table.find(\\\"fop\\\") == kj::none\", _kjCondition",
                 (char (*) [47])"failed: expected table.find(\"fop\") == kj::none",
                 (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_2c8);
      _kjCondition_9._39_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>(local_318,(char (*) [7])&_kjCondition.result);
  DebugExpressionStart::operator<<(local_310,(Maybe<kj::StringPtr_&> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<kj::StringPtr&>>::operator==
            ((DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_308,
             (DebugExpression<kj::Maybe<kj::StringPtr&>> *)local_310,(None *)&kj::none);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_308);
  if (!bVar2) {
    ref._7_1_ = Debug::shouldLog(ERROR);
    while (ref._7_1_ != false) {
      Debug::
      log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x55,ERROR,
                 "\"failed: expected \" \"table.find(\\\"baq\\\") == kj::none\", _kjCondition",
                 (char (*) [47])"failed: expected table.find(\"baq\") == kj::none",
                 (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_308);
      ref._7_1_ = false;
    }
  }
  StringPtr::StringPtr((StringPtr *)&_kjCondition_10.result,"baz");
  pSVar3 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::insert
                     ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)&_kjCondition.result,(StringPtr *)&_kjCondition_10.result);
  DStack_368 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,pSVar3);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_360,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffffc98,(char (*) [7])0x3208cd);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_360);
  if (!bVar2) {
    ref2._7_1_ = Debug::shouldLog(ERROR);
    while ((bool)ref2._7_1_ != false) {
      Debug::log<char_const(&)[30],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x59,ERROR,"\"failed: expected \" \"ref == \\\"baz\\\"\", _kjCondition"
                 ,(char (*) [30])"failed: expected ref == \"baz\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_360);
      ref2._7_1_ = false;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &local_388,(char (*) [7])&_kjCondition.result);
  local_380 = readMaybe<kj::StringPtr>(&local_388);
  if (local_380 == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_390,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,0x5a,FAILED,"table.find(\"baz\") != nullptr","");
    Debug::Fault::fatal(&local_390);
  }
  ppSVar4 = mv<kj::StringPtr*>(&local_380);
  _kjCondition_11._32_8_ = *ppSVar4;
  local_3d0 = pSVar3;
  _kj_result_2 = (StringPtr *)_kjCondition_11._32_8_;
  local_3c8 = (StringPtr *)
              DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_3d0);
  pSStack_3d8 = _kj_result_2;
  DebugExpression<kj::StringPtr*>::operator==
            ((DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_3c0,
             (DebugExpression<kj::StringPtr*> *)&local_3c8,&stack0xfffffffffffffc28);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_3c0);
  if (!bVar2) {
    _kjCondition_12._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_12._39_1_ != '\0') {
      Debug::log<char_const(&)[31],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x5b,ERROR,"\"failed: expected \" \"&ref == &ref2\", _kjCondition",
                 (char (*) [31])"failed: expected &ref == &ref2",
                 (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_3c0);
      _kjCondition_12._39_1_ = 0;
    }
  }
  sStack_418 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
               size((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                     *)&_kjCondition.result);
  local_410 = DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,&stack0xfffffffffffffbe8);
  iter._4_4_ = 3;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_408,&local_410,(int *)((long)&iter + 4));
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_408);
  if (!bVar2) {
    iter._3_1_ = Debug::shouldLog(ERROR);
    while ((bool)iter._3_1_ != false) {
      Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x5e,ERROR,"\"failed: expected \" \"table.size() == 3\", _kjCondition",
                 (char (*) [35])"failed: expected table.size() == 3",
                 (DebugComparison<unsigned_long,_int>_conflict *)local_408);
      iter._3_1_ = false;
    }
  }
  pSVar3 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::begin
                     ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)&_kjCondition.result);
  _kjCondition_13._32_8_ = pSVar3 + 1;
  DStack_458 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,pSVar3);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_450,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffffba8,(char (*) [7])0x31cf85);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_450);
  if (!bVar2) {
    _kjCondition_14._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_14._39_1_ != '\0') {
      Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x62,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"foo\\\"\", _kjCondition",
                 (char (*) [34])"failed: expected *iter++ == \"foo\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_450);
      _kjCondition_14._39_1_ = 0;
    }
  }
  uVar1 = _kjCondition_13._32_8_;
  _kjCondition_13._32_8_ = _kjCondition_13._32_8_ + 0x10;
  DStack_490 = DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,(StringPtr *)uVar1);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_488,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffffb70,(char (*) [7])0x30fda1);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_488);
  if (!bVar2) {
    _kjCondition_15._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_15._39_1_ != '\0') {
      Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x63,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"bar\\\"\", _kjCondition",
                 (char (*) [34])"failed: expected *iter++ == \"bar\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_488);
      _kjCondition_15._39_1_ = 0;
    }
  }
  uVar1 = _kjCondition_13._32_8_;
  _kjCondition_13._32_8_ = _kjCondition_13._32_8_ + 0x10;
  DStack_4c8 = DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,(StringPtr *)uVar1);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_4c0,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffffb38,(char (*) [7])0x3208cd);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_4c0);
  if (!bVar2) {
    _kjCondition_16._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_16._39_1_ != '\0') {
      Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x64,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"baz\\\"\", _kjCondition",
                 (char (*) [34])"failed: expected *iter++ == \"baz\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_4c0);
      _kjCondition_16._39_1_ = 0;
    }
  }
  local_500 = (StringPtr **)
              DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                         (StringPtr **)&_kjCondition_13.result);
  pSStack_508 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
                end((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                     *)&_kjCondition.result);
  DebugExpression<kj::StringPtr*&>::operator==
            ((DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_4f8,
             (DebugExpression<kj::StringPtr*&> *)&local_500,&stack0xfffffffffffffaf8);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_4f8);
  if (!bVar2) {
    _kjCondition_18._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_18._39_1_ != '\0') {
      Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x65,ERROR,
                 "\"failed: expected \" \"iter == table.end()\", _kjCondition",
                 (char (*) [37])"failed: expected iter == table.end()",
                 (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_4f8);
      _kjCondition_18._39_1_ = 0;
    }
  }
  _kjCondition_18._37_1_ =
       Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
       eraseMatch<0ul,char_const(&)[4]>
                 ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
                  &_kjCondition.result,(char (*) [7])0x31cf85);
  _kjCondition_18._38_1_ =
       DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,(bool *)&_kjCondition_18.field_0x25);
  bVar2 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&_kjCondition_18.field_0x26);
  if (!bVar2) {
    _kjCondition_18._36_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_18._36_1_ != '\0') {
      Debug::log<char_const(&)[41],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x68,ERROR,
                 "\"failed: expected \" \"table.eraseMatch(\\\"foo\\\")\", _kjCondition",
                 (char (*) [41])"failed: expected table.eraseMatch(\"foo\")",
                 (DebugExpression<bool> *)&_kjCondition_18.field_0x26);
      _kjCondition_18._36_1_ = 0;
    }
  }
  sStack_548 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
               size((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                     *)&_kjCondition.result);
  local_540 = DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,&stack0xfffffffffffffab8);
  _kjCondition_19._36_4_ = 2;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_538,&local_540,
             (int *)&_kjCondition_19.field_0x24);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_538);
  if (!bVar2) {
    _kjCondition_19._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_19._35_1_ != '\0') {
      Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x69,ERROR,"\"failed: expected \" \"table.size() == 2\", _kjCondition",
                 (char (*) [35])"failed: expected table.size() == 2",
                 (DebugComparison<unsigned_long,_int>_conflict *)local_538);
      _kjCondition_19._35_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>(local_588,(char (*) [7])&_kjCondition.result);
  DebugExpressionStart::operator<<(local_580,(Maybe<kj::StringPtr_&> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<kj::StringPtr&>>::operator==
            ((DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_578,
             (DebugExpression<kj::Maybe<kj::StringPtr&>> *)local_580,(None *)&kj::none);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_578);
  if (!bVar2) {
    _kjCondition_20._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_20._39_1_ != '\0') {
      Debug::
      log<char_const(&)[47],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x6a,ERROR,
                 "\"failed: expected \" \"table.find(\\\"foo\\\") == kj::none\", _kjCondition",
                 (char (*) [47])"failed: expected table.find(\"foo\") == kj::none",
                 (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_578);
      _kjCondition_20._39_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &local_5d0,(char (*) [7])&_kjCondition.result);
  local_5c8 = readMaybe<kj::StringPtr>(&local_5d0);
  if (local_5c8 == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_5d8,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,0x6b,FAILED,"table.find(\"bar\") != nullptr","");
    Debug::Fault::fatal(&local_5d8);
  }
  ppSVar4 = mv<kj::StringPtr*>(&local_5c8);
  _kj_result_3 = (StringPtr *)
                 DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,*ppSVar4)
  ;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_5b8,
             (DebugExpression<kj::StringPtr&> *)&_kj_result_3,(char (*) [7])0x30fda1);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_5b8);
  if (!bVar2) {
    _kjCondition_21._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_21._39_1_ != '\0') {
      Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x6b,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"bar\\\")) == \\\"bar\\\"\", _kjCondition"
                 ,(char (*) [63])
                  "failed: expected KJ_ASSERT_NONNULL(table.find(\"bar\")) == \"bar\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_5b8);
      _kjCondition_21._39_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &local_628,(char (*) [7])&_kjCondition.result);
  local_620 = readMaybe<kj::StringPtr>(&local_628);
  if (local_620 == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_630,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,0x6c,FAILED,"table.find(\"baz\") != nullptr","");
    Debug::Fault::fatal(&local_630);
  }
  ppSVar4 = mv<kj::StringPtr*>(&local_620);
  _kj_result_4 = (StringPtr *)
                 DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,*ppSVar4)
  ;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_610,
             (DebugExpression<kj::StringPtr&> *)&_kj_result_4,(char (*) [7])0x3208cd);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_610);
  if (!bVar2) {
    iter_1._7_1_ = Debug::shouldLog(ERROR);
    while (iter_1._7_1_ != false) {
      Debug::log<char_const(&)[63],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x6c,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"baz\\\")) == \\\"baz\\\"\", _kjCondition"
                 ,(char (*) [63])
                  "failed: expected KJ_ASSERT_NONNULL(table.find(\"baz\")) == \"baz\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_610);
      iter_1._7_1_ = false;
    }
  }
  pSVar3 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::begin
                     ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)&_kjCondition.result);
  _kjCondition_22._32_8_ = pSVar3 + 1;
  DStack_678 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,pSVar3);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_670,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffff988,(char (*) [7])0x3208cd);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_670);
  if (!bVar2) {
    _kjCondition_23._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_23._39_1_ != '\0') {
      Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x70,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"baz\\\"\", _kjCondition",
                 (char (*) [34])"failed: expected *iter++ == \"baz\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_670);
      _kjCondition_23._39_1_ = 0;
    }
  }
  uVar1 = _kjCondition_22._32_8_;
  _kjCondition_22._32_8_ = _kjCondition_22._32_8_ + 0x10;
  DStack_6b0 = DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,(StringPtr *)uVar1);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_6a8,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffff950,(char (*) [7])0x30fda1);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_6a8);
  if (!bVar2) {
    _kjCondition_24._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_24._39_1_ != '\0') {
      Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x71,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"bar\\\"\", _kjCondition",
                 (char (*) [34])"failed: expected *iter++ == \"bar\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_6a8);
      _kjCondition_24._39_1_ = 0;
    }
  }
  local_6e8 = (StringPtr **)
              DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                         (StringPtr **)&_kjCondition_22.result);
  pSStack_6f0 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
                end((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                     *)&_kjCondition.result);
  DebugExpression<kj::StringPtr*&>::operator==
            ((DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_6e0,
             (DebugExpression<kj::StringPtr*&> *)&local_6e8,&stack0xfffffffffffff910);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_6e0);
  if (!bVar2) {
    row._7_1_ = Debug::shouldLog(ERROR);
    while ((bool)row._7_1_ != false) {
      Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x72,ERROR,
                 "\"failed: expected \" \"iter == table.end()\", _kjCondition",
                 (char (*) [37])"failed: expected iter == table.end()",
                 (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_6e0);
      row._7_1_ = false;
    }
  }
  StringPtr::StringPtr(&local_710,"qux");
  local_700 = Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
              upsert<kj::_::(anonymous_namespace)::TestCase71::run()::__0>
                        ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                          *)&_kjCondition.result,&local_710,&local_711);
  str<char_const(&)[4]>((String *)local_730,(kj *)"qux",params);
  StringPtr::StringPtr(&local_740,(String *)local_730);
  found = (StringPtr *)local_730;
  local_748 = local_700;
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  upsert<kj::_::(anonymous_namespace)::TestCase71::run()::__1>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &_kjCondition.result,&local_740,(anon_class_16_2_624f6310 *)&found);
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[4]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &local_768,(char (*) [7])&_kjCondition.result);
  local_760 = readMaybe<kj::StringPtr>(&local_768);
  if (local_760 == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_770,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,0x80,FAILED,"table.find(\"qux\") != nullptr","");
    Debug::Fault::fatal(&local_770);
  }
  ppSVar4 = mv<kj::StringPtr*>(&local_760);
  local_7b0 = *ppSVar4;
  _kjCondition_25._32_8_ = local_7b0;
  _kj_result_5 = local_7b0;
  local_7a8 = (StringPtr *)
              DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_7b0);
  pSStack_7b8 = local_700;
  DebugExpression<kj::StringPtr*>::operator==
            ((DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_7a0,
             (DebugExpression<kj::StringPtr*> *)&local_7a8,&stack0xfffffffffffff848);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_7a0);
  if (!bVar2) {
    local_7b9 = Debug::shouldLog(ERROR);
    while (local_7b9 != false) {
      Debug::log<char_const(&)[32],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x81,ERROR,"\"failed: expected \" \"&found == &row\", _kjCondition",
                 (char (*) [32])"failed: expected &found == &row",
                 (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_7a0);
      local_7b9 = false;
    }
  }
  String::~String((String *)local_730);
  STRS[1].content.size_ = (size_t)anon_var_dwarf_f4b43;
  STRS[2].content.ptr = (char *)0x7;
  STRS[0].content.size_ = (size_t)anon_var_dwarf_f4b2a;
  STRS[1].content.ptr = (char *)0x7;
  auStack_7f8 = (undefined1  [8])0x31319d;
  STRS[0].content.ptr = (char *)0x6;
  ArrayPtr<kj::StringPtr>::ArrayPtr<3ul>
            ((ArrayPtr<kj::StringPtr> *)&_kjCondition_26.result,(StringPtr (*) [3])auStack_7f8);
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  insertAll<kj::ArrayPtr<kj::StringPtr>>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &_kjCondition.result,(ArrayPtr<kj::StringPtr> *)&_kjCondition_26.result);
  sStack_840 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
               size((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                     *)&_kjCondition.result);
  local_838 = DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,&stack0xfffffffffffff7c0);
  _kjCondition_27._36_4_ = 6;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_830,&local_838,
             (int *)&_kjCondition_27.field_0x24);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_830);
  if (!bVar2) {
    _kjCondition_27._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_27._35_1_ != '\0') {
      Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x86,ERROR,"\"failed: expected \" \"table.size() == 6\", _kjCondition",
                 (char (*) [35])"failed: expected table.size() == 6",
                 (DebugComparison<unsigned_long,_int>_conflict *)local_830);
      _kjCondition_27._35_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[6]>(local_880,(char (*) [7])&_kjCondition.result);
  DebugExpressionStart::operator<<(local_878,(Maybe<kj::StringPtr_&> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<kj::StringPtr&>>::operator!=
            ((DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_870,
             (DebugExpression<kj::Maybe<kj::StringPtr&>> *)local_878,(None *)&kj::none);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_870);
  if (!bVar2) {
    _kjCondition_28._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_28._39_1_ != '\0') {
      Debug::
      log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x87,ERROR,
                 "\"failed: expected \" \"table.find(\\\"corge\\\") != kj::none\", _kjCondition",
                 (char (*) [49])"failed: expected table.find(\"corge\") != kj::none",
                 (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_870);
      _kjCondition_28._39_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[7]>(local_8c0,(char (*) [7])&_kjCondition.result);
  DebugExpressionStart::operator<<(local_8b8,(Maybe<kj::StringPtr_&> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<kj::StringPtr&>>::operator!=
            ((DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_8b0,
             (DebugExpression<kj::Maybe<kj::StringPtr&>> *)local_8b8,(None *)&kj::none);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_8b0);
  if (!bVar2) {
    _kjCondition_29._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_29._39_1_ != '\0') {
      Debug::
      log<char_const(&)[50],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x88,ERROR,
                 "\"failed: expected \" \"table.find(\\\"grault\\\") != kj::none\", _kjCondition",
                 (char (*) [50])"failed: expected table.find(\"grault\") != kj::none",
                 (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_8b0);
      _kjCondition_29._39_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[7]>(local_900,(char (*) [7])&_kjCondition.result);
  DebugExpressionStart::operator<<(local_8f8,(Maybe<kj::StringPtr_&> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<kj::StringPtr&>>::operator!=
            ((DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_8f0,
             (DebugExpression<kj::Maybe<kj::StringPtr&>> *)local_8f8,(None *)&kj::none);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_8f0);
  func = extraout_RDX;
  if (!bVar2) {
    _e139.field_1._399_1_ = Debug::shouldLog(ERROR);
    func = extraout_RDX_00;
    while (_e139.field_1._399_1_ != '\0') {
      Debug::
      log<char_const(&)[50],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x89,ERROR,
                 "\"failed: expected \" \"table.find(\\\"garply\\\") != kj::none\", _kjCondition",
                 (char (*) [50])"failed: expected table.find(\"garply\") != kj::none",
                 (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_8f0);
      func = extraout_RDX_01;
      _e139.field_1._399_1_ = 0;
    }
  }
  e = (Exception_conflict *)&_kjCondition.result;
  runCatchingExceptions<kj::_::(anonymous_namespace)::TestCase71::run()::__2>
            (&local_c38,(kj *)&e,func);
  other = readMaybe<kj::Exception>(&local_c38);
  NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_aa0,other);
  Maybe<kj::Exception>::~Maybe(&local_c38);
  pEVar5 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_aa0);
  if (pEVar5 == (Exception *)0x0) {
    _kjCondition_31._38_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_31._38_1_ != '\0') {
      Debug::log<char_const(&)[40]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,0x8b,ERROR,"\"code did not throw: \" \"table.insert(\\\"bar\\\")\"",
                 (char (*) [40])"code did not throw: table.insert(\"bar\")");
      _kjCondition_31._38_1_ = 0;
    }
  }
  else {
    pEStack_c48 = NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_aa0)
    ;
    local_c60 = (ArrayPtr<const_char>)Exception::getDescription(pEStack_c48);
    StringPtr::StringPtr((StringPtr *)local_c70,"inserted row already exists in table");
    local_c4a = StringPtr::contains((StringPtr *)&local_c60,(StringPtr *)local_c70);
    local_c49 = DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_c4a);
    bVar2 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_c49);
    if (!bVar2) {
      _kjCondition_31._39_1_ = Debug::shouldLog(ERROR);
      while (_kjCondition_31._39_1_ != '\0') {
        Debug::log<char_const(&)[85],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                   ,(char  [7])0x8b,ERROR,
                   "\"failed: expected \" \"e.getDescription().contains(\\\"inserted row already exists in table\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                   ,(char (*) [85])
                    "failed: expected e.getDescription().contains(\"inserted row already exists in table\")"
                   ,&local_c49,
                   (char (*) [56])"exception description didn\'t contain expected substring",
                   (Exception_conflict *)pEStack_c48);
        _kjCondition_31._39_1_ = 0;
      }
    }
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_aa0);
  sStack_cb0 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
               size((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                     *)&_kjCondition.result);
  local_ca8 = DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,&stack0xfffffffffffff350);
  _kjCondition_32._36_4_ = 6;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_ca0,&local_ca8,
             (int *)&_kjCondition_32.field_0x24);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_ca0);
  if (!bVar2) {
    _kjCondition_32._35_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_32._35_1_ != '\0') {
      Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x8d,ERROR,"\"failed: expected \" \"table.size() == 6\", _kjCondition",
                 (char (*) [35])"failed: expected table.size() == 6",
                 (DebugComparison<unsigned_long,_int>_conflict *)local_ca0);
      _kjCondition_32._35_1_ = 0;
    }
  }
  StringPtr::StringPtr((StringPtr *)local_cf8,"baa");
  pSVar3 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::insert
                     ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)&_kjCondition.result,(StringPtr *)local_cf8);
  local_ce8 = (StringPtr *)
              DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,pSVar3);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_ce0,
             (DebugExpression<kj::StringPtr&> *)&local_ce8,(char (*) [7])"baa");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_ce0);
  if (!bVar2) {
    _kjCondition_33._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_33._39_1_ != '\0') {
      Debug::log<char_const(&)[46],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x8f,ERROR,
                 "\"failed: expected \" \"table.insert(\\\"baa\\\") == \\\"baa\\\"\", _kjCondition",
                 (char (*) [46])"failed: expected table.insert(\"baa\") == \"baa\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_ce0);
      _kjCondition_33._39_1_ = 0;
    }
  }
  local_d38 = Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
              eraseAll<kj::_::(anonymous_namespace)::TestCase71::run()::__3,bool>
                        ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                          *)&_kjCondition.result,(anon_class_1_0_00000001 *)&_kj_shouldLog_34);
  local_d30 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_d38);
  local_d40 = 3;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_d28,&local_d30,&local_d40);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_d28);
  if (!bVar2) {
    _kjCondition_34._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_34._39_1_ != '\0') {
      Debug::log<char_const(&)[85],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x91,ERROR,
                 "\"failed: expected \" \"table.eraseAll([](StringPtr s) { return s.startsWith(\\\"ba\\\"); }) == 3\", _kjCondition"
                 ,(char (*) [85])
                  "failed: expected table.eraseAll([](StringPtr s) { return s.startsWith(\"ba\"); }) == 3"
                 ,(DebugComparison<unsigned_long,_int>_conflict *)local_d28);
      _kjCondition_34._39_1_ = 0;
    }
  }
  sStack_d80 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
               size((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                     *)&_kjCondition.result);
  local_d78 = DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,&stack0xfffffffffffff280);
  iter_2._4_4_ = 4;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_d70,&local_d78,(int *)((long)&iter_2 + 4))
  ;
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_d70);
  if (!bVar2) {
    iter_2._3_1_ = Debug::shouldLog(ERROR);
    while ((bool)iter_2._3_1_ != false) {
      Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x92,ERROR,"\"failed: expected \" \"table.size() == 4\", _kjCondition",
                 (char (*) [35])"failed: expected table.size() == 4",
                 (DebugComparison<unsigned_long,_int>_conflict *)local_d70);
      iter_2._3_1_ = false;
    }
  }
  pSVar3 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::begin
                     ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)&_kjCondition.result);
  _kjCondition_35._32_8_ = pSVar3 + 1;
  DStack_dc0 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,pSVar3);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_db8,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffff240,(char (*) [7])"garply");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_db8);
  if (!bVar2) {
    _kjCondition_36._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_36._39_1_ != '\0') {
      Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x96,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"garply\\\"\", _kjCondition",
                 (char (*) [37])"failed: expected *iter++ == \"garply\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_db8);
      _kjCondition_36._39_1_ = 0;
    }
  }
  uVar1 = _kjCondition_35._32_8_;
  _kjCondition_35._32_8_ = _kjCondition_35._32_8_ + 0x10;
  DStack_df8 = DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,(StringPtr *)uVar1);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_df0,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffff208,(char (*) [7])"grault");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_df0);
  if (!bVar2) {
    _kjCondition_37._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_37._39_1_ != '\0') {
      Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x97,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"grault\\\"\", _kjCondition",
                 (char (*) [37])"failed: expected *iter++ == \"grault\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_df0);
      _kjCondition_37._39_1_ = 0;
    }
  }
  uVar1 = _kjCondition_35._32_8_;
  _kjCondition_35._32_8_ = _kjCondition_35._32_8_ + 0x10;
  DStack_e30 = DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,(StringPtr *)uVar1);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_e28,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffff1d0,(char (*) [7])"qux");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_e28);
  if (!bVar2) {
    _kjCondition_38._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_38._39_1_ != '\0') {
      Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x98,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"qux\\\"\", _kjCondition",
                 (char (*) [34])"failed: expected *iter++ == \"qux\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_e28);
      _kjCondition_38._39_1_ = 0;
    }
  }
  uVar1 = _kjCondition_35._32_8_;
  _kjCondition_35._32_8_ = _kjCondition_35._32_8_ + 0x10;
  DStack_e68 = DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,(StringPtr *)uVar1);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_e60,
             (DebugExpression<kj::StringPtr&> *)&stack0xfffffffffffff198,(char (*) [7])"corge");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_e60);
  if (!bVar2) {
    _kjCondition_39._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_39._39_1_ != '\0') {
      Debug::log<char_const(&)[36],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x99,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"corge\\\"\", _kjCondition",
                 (char (*) [36])"failed: expected *iter++ == \"corge\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_e60);
      _kjCondition_39._39_1_ = 0;
    }
  }
  local_ea0 = (StringPtr **)
              DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                         (StringPtr **)&_kjCondition_35.result);
  pSStack_ea8 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
                end((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                     *)&_kjCondition.result);
  DebugExpression<kj::StringPtr*&>::operator==
            ((DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_e98,
             (DebugExpression<kj::StringPtr*&> *)&local_ea0,&stack0xfffffffffffff158);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_e98);
  if (!bVar2) {
    graultRow._7_1_ = Debug::shouldLog(ERROR);
    while (graultRow._7_1_ != false) {
      Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0x9a,ERROR,
                 "\"failed: expected \" \"iter == table.end()\", _kjCondition",
                 (char (*) [37])"failed: expected iter == table.end()",
                 (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_e98);
      graultRow._7_1_ = false;
    }
  }
  pSVar3 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::begin
                     ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)&_kjCondition.result);
  pSVar3 = pSVar3 + 1;
  _kjCondition_40._32_8_ = (pSVar3->content).ptr;
  local_f00 = Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
              findOrCreate<0ul,char_const(&)[7],kj::_::(anonymous_namespace)::TestCase71::run()::__4>
                        ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                          *)&_kjCondition.result,(char (*) [7])"grault",&local_f01);
  local_ef8 = (StringPtr *)
              DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_f00);
  pSStack_f10 = pSVar3;
  DebugExpression<kj::StringPtr*>::operator==
            ((DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_ef0,
             (DebugExpression<kj::StringPtr*> *)&local_ef8,&stack0xfffffffffffff0f0);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_ef0);
  if (!bVar2) {
    _kjCondition_41._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_41._39_1_ != '\0') {
      Debug::log<char_const(&)[135],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xa1,ERROR,
                 "\"failed: expected \" \"&table.findOrCreate(\\\"grault\\\", [&]() -> kj::StringPtr { KJ_FAIL_ASSERT(\\\"shouldn\'t have called this\\\"); }) == &graultRow\", _kjCondition"
                 ,(char (*) [135])
                  "failed: expected &table.findOrCreate(\"grault\", [&]() -> kj::StringPtr { KJ_FAIL_ASSERT(\"shouldn\'t have called this\"); }) == &graultRow"
                 ,(DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_ef0);
      _kjCondition_41._39_1_ = 0;
    }
  }
  local_f50 = StringPtr::begin(pSVar3);
  local_f48 = (char *)DebugExpressionStart::operator<<
                                ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_f50);
  pcStack_f58 = StringPtr::begin((StringPtr *)&_kjCondition_40.result);
  DebugExpression<char_const*>::operator==
            ((DebugComparison<const_char_*,_const_char_*> *)local_f40,
             (DebugExpression<char_const*> *)&local_f48,&stack0xfffffffffffff0a8);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_f40);
  if (!bVar2) {
    _kjCondition_42._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_42._39_1_ != '\0') {
      Debug::log<char_const(&)[57],kj::_::DebugComparison<char_const*,char_const*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xa2,ERROR,
                 "\"failed: expected \" \"graultRow.begin() == origGrault.begin()\", _kjCondition",
                 (char (*) [57])"failed: expected graultRow.begin() == origGrault.begin()",
                 (DebugComparison<const_char_*,_const_char_*> *)local_f40);
      _kjCondition_42._39_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[7]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &local_fa8,(char (*) [7])&_kjCondition.result);
  local_fa0 = readMaybe<kj::StringPtr>(&local_fa8);
  if (local_fa0 == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_fb0,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,0xa3,FAILED,"table.find(\"grault\") != nullptr","");
    Debug::Fault::fatal(&local_fb0);
  }
  ppSVar4 = mv<kj::StringPtr*>(&local_fa0);
  local_fb8 = *ppSVar4;
  _kj_result_6 = local_fb8;
  local_f90 = (StringPtr *)
              DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&_::MAGIC_ASSERT,&_kj_result_6);
  pSStack_fc0 = pSVar3;
  DebugExpression<kj::StringPtr*>::operator==
            ((DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_f88,
             (DebugExpression<kj::StringPtr*> *)&local_f90,&stack0xfffffffffffff040);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_f88);
  if (!bVar2) {
    _kjCondition_43._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_43._39_1_ != '\0') {
      Debug::log<char_const(&)[72],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xa3,ERROR,
                 "\"failed: expected \" \"&KJ_ASSERT_NONNULL(table.find(\\\"grault\\\")) == &graultRow\", _kjCondition"
                 ,(char (*) [72])
                  "failed: expected &KJ_ASSERT_NONNULL(table.find(\"grault\")) == &graultRow",
                 (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_f88);
      _kjCondition_43._39_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[6]>(local_1000,(char (*) [7])&_kjCondition.result);
  DebugExpressionStart::operator<<(local_ff8,(Maybe<kj::StringPtr_&> *)&_::MAGIC_ASSERT);
  DebugExpression<kj::Maybe<kj::StringPtr&>>::operator==
            ((DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_ff0,
             (DebugExpression<kj::Maybe<kj::StringPtr&>> *)local_ff8,(None *)&kj::none);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_ff0);
  if (!bVar2) {
    _kjCondition_44._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_44._39_1_ != '\0') {
      Debug::
      log<char_const(&)[49],kj::_::DebugComparison<kj::Maybe<kj::StringPtr&>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xa4,ERROR,
                 "\"failed: expected \" \"table.find(\\\"waldo\\\") == kj::none\", _kjCondition",
                 (char (*) [49])"failed: expected table.find(\"waldo\") == kj::none",
                 (DebugComparison<kj::Maybe<kj::StringPtr_&>,_const_kj::None_&> *)local_ff0);
      _kjCondition_44._39_1_ = 0;
    }
  }
  sStack_1040 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
                size((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                      *)&_kjCondition.result);
  local_1038 = DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,&stack0xffffffffffffefc0);
  local_1044 = 4;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_1030,&local_1038,&local_1044);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1030);
  params_00 = extraout_RDX_02;
  if (!bVar2) {
    local_1045 = Debug::shouldLog(ERROR);
    params_00 = extraout_RDX_03;
    while (local_1045 != false) {
      Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xa5,ERROR,"\"failed: expected \" \"table.size() == 4\", _kjCondition",
                 (char (*) [35])"failed: expected table.size() == 4",
                 (DebugComparison<unsigned_long,_int>_conflict *)local_1030);
      params_00 = extraout_RDX_04;
      local_1045 = false;
    }
  }
  str<char_const(&)[6]>((String *)local_1060,(kj *)0x313d02,params_00);
  str<char_const(&)[6]>((String *)&waldo,(kj *)0x313d02,params_01);
  _kjCondition_45._32_8_ = &waldo;
  pSVar3 = Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
           findOrCreate<0ul,kj::String&,kj::_::(anonymous_namespace)::TestCase71::run()::__5>
                     ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>
                       *)&_kjCondition.result,(char (*) [7])local_1060,
                      (Type *)&_kjCondition_45.result);
  DStack_10b8 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,pSVar3);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_10b0,
             (DebugExpression<kj::StringPtr&> *)&stack0xffffffffffffef48,(char (*) [7])0x313d02);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_10b0);
  if (!bVar2) {
    _kjCondition_46._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_46._39_1_ != '\0') {
      Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xac,ERROR,
                 "\"failed: expected \" \"waldo == \\\"waldo\\\"\", _kjCondition",
                 (char (*) [34])"failed: expected waldo == \"waldo\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_10b0);
      _kjCondition_46._39_1_ = 0;
    }
  }
  local_10f8 = StringPtr::begin(pSVar3);
  local_10f0 = (char *)DebugExpressionStart::operator<<
                                 ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_10f8);
  pcStack_1100 = String::begin((String *)&waldo);
  DebugExpression<char_const*>::operator==
            ((DebugComparison<const_char_*,_char_*> *)local_10e8,
             (DebugExpression<char_const*> *)&local_10f0,&stack0xffffffffffffef00);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_10e8);
  if (!bVar2) {
    _kjCondition_47._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_47._39_1_ != '\0') {
      Debug::log<char_const(&)[54],kj::_::DebugComparison<char_const*,char*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xad,ERROR,
                 "\"failed: expected \" \"waldo.begin() == insertWaldo.begin()\", _kjCondition",
                 (char (*) [54])"failed: expected waldo.begin() == insertWaldo.begin()",
                 (DebugComparison<const_char_*,_char_*> *)local_10e8);
      _kjCondition_47._39_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[7]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &local_1148,(char (*) [7])&_kjCondition.result);
  local_1140 = readMaybe<kj::StringPtr>(&local_1148);
  if (local_1140 == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_1150,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,0xae,FAILED,"table.find(\"grault\") != nullptr","");
    Debug::Fault::fatal(&local_1150);
  }
  ppSVar4 = mv<kj::StringPtr*>(&local_1140);
  _kj_result_7 = (StringPtr *)
                 DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,*ppSVar4)
  ;
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_1130,
             (DebugExpression<kj::StringPtr&> *)&_kj_result_7,(char (*) [7])"grault");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1130);
  if (!bVar2) {
    _kjCondition_48._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_48._39_1_ != '\0') {
      Debug::log<char_const(&)[69],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xae,ERROR,
                 "\"failed: expected \" \"KJ_ASSERT_NONNULL(table.find(\\\"grault\\\")) == \\\"grault\\\"\", _kjCondition"
                 ,(char (*) [69])
                  "failed: expected KJ_ASSERT_NONNULL(table.find(\"grault\")) == \"grault\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_1130);
      _kjCondition_48._39_1_ = 0;
    }
  }
  Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
  find<0ul,char_const(&)[6]>
            ((Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *)
             &local_11a8,(char (*) [7])&_kjCondition.result);
  local_11a0 = readMaybe<kj::StringPtr>(&local_11a8);
  if (local_11a0 == (StringPtr *)0x0) {
    Debug::Fault::Fault(&local_11b0,
                        "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                        ,0xaf,FAILED,"table.find(\"waldo\") != nullptr","");
    Debug::Fault::fatal(&local_11b0);
  }
  ppSVar4 = mv<kj::StringPtr*>(&local_11a0);
  local_11b8 = *ppSVar4;
  _kj_result_8 = local_11b8;
  local_1190 = (StringPtr *)
               DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,&_kj_result_8);
  pSStack_11c0 = pSVar3;
  DebugExpression<kj::StringPtr*>::operator==
            ((DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_1188,
             (DebugExpression<kj::StringPtr*> *)&local_1190,&stack0xffffffffffffee40);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1188);
  if (!bVar2) {
    _kjCondition_49._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_49._39_1_ != '\0') {
      Debug::log<char_const(&)[67],kj::_::DebugComparison<kj::StringPtr*,kj::StringPtr*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xaf,ERROR,
                 "\"failed: expected \" \"&KJ_ASSERT_NONNULL(table.find(\\\"waldo\\\")) == &waldo\", _kjCondition"
                 ,(char (*) [67])
                  "failed: expected &KJ_ASSERT_NONNULL(table.find(\"waldo\")) == &waldo",
                 (DebugComparison<kj::StringPtr_*,_kj::StringPtr_*> *)local_1188);
      _kjCondition_49._39_1_ = 0;
    }
  }
  sStack_1200 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
                size((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                      *)&_kjCondition.result);
  local_11f8 = DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,&stack0xffffffffffffee00);
  iter_3._4_4_ = 5;
  DebugExpression<unsigned_long>::operator==
            ((DebugComparison<unsigned_long,_int> *)local_11f0,&local_11f8,
             (int *)((long)&iter_3 + 4));
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_11f0);
  if (!bVar2) {
    iter_3._3_1_ = Debug::shouldLog(ERROR);
    while ((bool)iter_3._3_1_ != false) {
      Debug::log<char_const(&)[35],kj::_::DebugComparison<unsigned_long,int>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xb0,ERROR,"\"failed: expected \" \"table.size() == 5\", _kjCondition",
                 (char (*) [35])"failed: expected table.size() == 5",
                 (DebugComparison<unsigned_long,_int>_conflict *)local_11f0);
      iter_3._3_1_ = false;
    }
  }
  pSVar3 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::begin
                     ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                       *)&_kjCondition.result);
  _kjCondition_50._32_8_ = pSVar3 + 1;
  DStack_1240 = DebugExpressionStart::operator<<((DebugExpressionStart *)&_::MAGIC_ASSERT,pSVar3);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_1238,
             (DebugExpression<kj::StringPtr&> *)&stack0xffffffffffffedc0,(char (*) [7])"garply");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1238);
  if (!bVar2) {
    _kjCondition_51._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_51._39_1_ != '\0') {
      Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xb4,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"garply\\\"\", _kjCondition",
                 (char (*) [37])"failed: expected *iter++ == \"garply\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_1238);
      _kjCondition_51._39_1_ = 0;
    }
  }
  uVar1 = _kjCondition_50._32_8_;
  _kjCondition_50._32_8_ = _kjCondition_50._32_8_ + 0x10;
  DStack_1278 = DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&_::MAGIC_ASSERT,(StringPtr *)uVar1);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_1270,
             (DebugExpression<kj::StringPtr&> *)&stack0xffffffffffffed88,(char (*) [7])"grault");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1270);
  if (!bVar2) {
    _kjCondition_52._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_52._39_1_ != '\0') {
      Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[7]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xb5,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"grault\\\"\", _kjCondition",
                 (char (*) [37])"failed: expected *iter++ == \"grault\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[7]> *)local_1270);
      _kjCondition_52._39_1_ = 0;
    }
  }
  uVar1 = _kjCondition_50._32_8_;
  _kjCondition_50._32_8_ = _kjCondition_50._32_8_ + 0x10;
  DStack_12b0 = DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&_::MAGIC_ASSERT,(StringPtr *)uVar1);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_12a8,
             (DebugExpression<kj::StringPtr&> *)&stack0xffffffffffffed50,(char (*) [7])"qux");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_12a8);
  if (!bVar2) {
    _kjCondition_53._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_53._39_1_ != '\0') {
      Debug::log<char_const(&)[34],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[4]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xb6,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"qux\\\"\", _kjCondition",
                 (char (*) [34])"failed: expected *iter++ == \"qux\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[4]> *)local_12a8);
      _kjCondition_53._39_1_ = 0;
    }
  }
  uVar1 = _kjCondition_50._32_8_;
  _kjCondition_50._32_8_ = _kjCondition_50._32_8_ + 0x10;
  DStack_12e8 = DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&_::MAGIC_ASSERT,(StringPtr *)uVar1);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_12e0,
             (DebugExpression<kj::StringPtr&> *)&stack0xffffffffffffed18,(char (*) [7])"corge");
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_12e0);
  if (!bVar2) {
    _kjCondition_54._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_54._39_1_ != '\0') {
      Debug::log<char_const(&)[36],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xb7,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"corge\\\"\", _kjCondition",
                 (char (*) [36])"failed: expected *iter++ == \"corge\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_12e0);
      _kjCondition_54._39_1_ = 0;
    }
  }
  uVar1 = _kjCondition_50._32_8_;
  _kjCondition_50._32_8_ = _kjCondition_50._32_8_ + 0x10;
  DStack_1320 = DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&_::MAGIC_ASSERT,(StringPtr *)uVar1);
  DebugExpression<kj::StringPtr&>::operator==
            ((DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_1318,
             (DebugExpression<kj::StringPtr&> *)&stack0xffffffffffffece0,(char (*) [7])0x313d02);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1318);
  if (!bVar2) {
    _kjCondition_55._39_1_ = Debug::shouldLog(ERROR);
    while (_kjCondition_55._39_1_ != '\0') {
      Debug::log<char_const(&)[36],kj::_::DebugComparison<kj::StringPtr&,char_const(&)[6]>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xb8,ERROR,
                 "\"failed: expected \" \"*iter++ == \\\"waldo\\\"\", _kjCondition",
                 (char (*) [36])"failed: expected *iter++ == \"waldo\"",
                 (DebugComparison<kj::StringPtr_&,_const_char_(&)[6]> *)local_1318);
      _kjCondition_55._39_1_ = 0;
    }
  }
  local_1358 = (StringPtr **)
               DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                          (StringPtr **)&_kjCondition_50.result);
  pSStack_1360 = Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::
                 end((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>
                      *)&_kjCondition.result);
  DebugExpression<kj::StringPtr*&>::operator==
            ((DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_1350,
             (DebugExpression<kj::StringPtr*&> *)&local_1358,&stack0xffffffffffffeca0);
  bVar2 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_1350);
  if (!bVar2) {
    local_1361 = Debug::shouldLog(ERROR);
    while (local_1361 != false) {
      Debug::log<char_const(&)[37],kj::_::DebugComparison<kj::StringPtr*&,kj::StringPtr*>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table-test.c++"
                 ,(char  [7])0xb9,ERROR,
                 "\"failed: expected \" \"iter == table.end()\", _kjCondition",
                 (char (*) [37])"failed: expected iter == table.end()",
                 (DebugComparison<kj::StringPtr_*&,_kj::StringPtr_*> *)local_1350);
      local_1361 = false;
    }
  }
  String::~String((String *)&waldo);
  String::~String((String *)local_1060);
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_>::~Table
            ((Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
             &_kjCondition.result);
  return;
}

Assistant:

TEST(String, StartsEndsWith) {
  EXPECT_TRUE("foobar"_kj.startsWith("foo"));
  EXPECT_FALSE("foobar"_kj.startsWith("bar"));
  EXPECT_FALSE("foobar"_kj.endsWith("foo"));
  EXPECT_TRUE("foobar"_kj.endsWith("bar"));

  EXPECT_FALSE("fo"_kj.startsWith("foo"));
  EXPECT_FALSE("fo"_kj.endsWith("foo"));

  EXPECT_TRUE("foobar"_kj.startsWith(""));
  EXPECT_TRUE("foobar"_kj.endsWith(""));
}